

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libasd_py.cpp
# Opt level: O2

PyObject * PyInit_libasd(void)

{
  int iVar1;
  char *__s1;
  module_ m;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module(&m,"libasd",(char *)0x0,&pybind11_module_def_libasd);
    local_38.obj.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_38.key = "__doc__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,(char (*) [53])"libasd -- library to read and write .asd format file");
    pybind11::object::~object(&local_38.cache);
    add_header_enums(&m);
    add_header_classes(&m);
    add_frame_headers(&m);
    add_frame_data(&m);
    add_frame_classes(&m);
    add_data_classes(&m);
    add_read_header(&m);
    add_read_asd(&m);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(libasd, mod)
{
    mod.doc() = "libasd -- library to read and write .asd format file";

    add_header_enums  (mod);
    add_header_classes(mod);
    add_frame_headers (mod);
    add_frame_data    (mod);
    add_frame_classes (mod);
    add_data_classes  (mod);
    add_read_header   (mod);
    add_read_asd      (mod);
}